

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  Scene *pSVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Geometry *pGVar9;
  RTCIntersectArguments *pRVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  bool bVar56;
  ulong uVar57;
  long lVar58;
  long lVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  undefined4 uVar65;
  ulong unaff_R12;
  size_t mask;
  int iVar66;
  ulong uVar67;
  ulong uVar68;
  bool bVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar84;
  float fVar85;
  float fVar87;
  undefined1 auVar81 [32];
  float fVar83;
  float fVar86;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar82 [32];
  float fVar91;
  float fVar97;
  float fVar98;
  undefined1 auVar92 [16];
  float fVar100;
  float fVar101;
  float fVar103;
  undefined1 auVar93 [32];
  float fVar99;
  float fVar102;
  float fVar104;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  float fVar105;
  float fVar111;
  float fVar112;
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  float fVar113;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar110 [64];
  float fVar117;
  float fVar118;
  float fVar125;
  float fVar127;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  float fVar126;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar132;
  float fVar134;
  float fVar136;
  undefined1 auVar123 [32];
  float fVar131;
  float fVar133;
  float fVar135;
  undefined1 auVar124 [64];
  float fVar137;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar140 [64];
  float fVar147;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar150 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  float fVar162;
  float fVar163;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar164 [64];
  float fVar177;
  float fVar178;
  undefined1 auVar179 [32];
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar180 [64];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  float fVar197;
  float fVar198;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  undefined1 auVar199 [32];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_d54;
  ulong local_d50;
  ulong *local_d48;
  ulong local_d40;
  ulong local_d38;
  undefined1 local_d30 [16];
  undefined1 local_d20 [16];
  undefined1 local_d10 [16];
  undefined1 local_d00 [16];
  undefined1 local_cf0 [16];
  undefined1 local_ce0 [16];
  undefined1 local_cd0 [16];
  undefined1 local_cc0 [16];
  undefined1 local_cb0 [16];
  undefined1 local_ca0 [16];
  undefined1 local_c90 [16];
  ulong local_c78;
  ulong local_c70;
  ulong local_c68;
  undefined4 local_c60;
  float local_c5c;
  float local_c58;
  undefined4 local_c54;
  undefined4 local_c50;
  undefined4 local_c4c;
  uint local_c48;
  uint local_c44;
  uint local_c40;
  RTCFilterFunctionNArguments local_c30;
  undefined8 local_c00;
  float fStack_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  float fStack_be4;
  undefined8 local_be0;
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  float local_bc0;
  float fStack_bbc;
  float fStack_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float fStack_ba8;
  float fStack_ba4;
  undefined1 local_ba0 [32];
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [32];
  ulong local_800;
  ulong local_7f8 [249];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      local_d48 = local_7f8;
      local_800 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar70 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar2 = (ray->dir).field_0;
      auVar71._8_4_ = 0x7fffffff;
      auVar71._0_8_ = 0x7fffffff7fffffff;
      auVar71._12_4_ = 0x7fffffff;
      auVar71 = vandps_avx((undefined1  [16])aVar2,auVar71);
      auVar119._8_4_ = 0x219392ef;
      auVar119._0_8_ = 0x219392ef219392ef;
      auVar119._12_4_ = 0x219392ef;
      auVar71 = vcmpps_avx(auVar71,auVar119,1);
      auVar120._8_4_ = 0x3f800000;
      auVar120._0_8_ = &DAT_3f8000003f800000;
      auVar120._12_4_ = 0x3f800000;
      auVar119 = vdivps_avx(auVar120,(undefined1  [16])aVar2);
      auVar121._8_4_ = 0x5d5e0b6b;
      auVar121._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar121._12_4_ = 0x5d5e0b6b;
      auVar71 = vblendvps_avx(auVar119,auVar121,auVar71);
      auVar106._0_4_ = auVar71._0_4_ * 0.99999964;
      auVar106._4_4_ = auVar71._4_4_ * 0.99999964;
      auVar106._8_4_ = auVar71._8_4_ * 0.99999964;
      auVar106._12_4_ = auVar71._12_4_ * 0.99999964;
      auVar92._0_4_ = auVar71._0_4_ * 1.0000004;
      auVar92._4_4_ = auVar71._4_4_ * 1.0000004;
      auVar92._8_4_ = auVar71._8_4_ * 1.0000004;
      auVar92._12_4_ = auVar71._12_4_ * 1.0000004;
      uVar65 = *(undefined4 *)&(ray->org).field_0;
      local_ca0._4_4_ = uVar65;
      local_ca0._0_4_ = uVar65;
      local_ca0._8_4_ = uVar65;
      local_ca0._12_4_ = uVar65;
      auVar150 = ZEXT1664(local_ca0);
      uVar65 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_cb0._4_4_ = uVar65;
      local_cb0._0_4_ = uVar65;
      local_cb0._8_4_ = uVar65;
      local_cb0._12_4_ = uVar65;
      auVar157 = ZEXT1664(local_cb0);
      local_cc0 = vshufps_avx(auVar106,auVar106,0);
      auVar159 = ZEXT1664(local_cc0);
      auVar71 = vmovshdup_avx(auVar106);
      local_cd0 = vshufps_avx(auVar106,auVar106,0x55);
      auVar161 = ZEXT1664(local_cd0);
      auVar119 = vshufpd_avx(auVar106,auVar106,1);
      local_ce0 = vshufps_avx(auVar106,auVar106,0xaa);
      auVar164 = ZEXT1664(local_ce0);
      local_cf0 = vshufps_avx(auVar92,auVar92,0);
      auVar180 = ZEXT1664(local_cf0);
      local_d00 = vshufps_avx(auVar92,auVar92,0x55);
      auVar194 = ZEXT1664(local_d00);
      local_d10 = vshufps_avx(auVar92,auVar92,0xaa);
      auVar196 = ZEXT1664(local_d10);
      local_d50 = (ulong)(auVar106._0_4_ < 0.0) << 4;
      uVar67 = (ulong)(auVar71._0_4_ < 0.0) << 4 | 0x20;
      uVar68 = (ulong)(auVar119._0_4_ < 0.0) << 4 | 0x40;
      uVar63 = local_d50 ^ 0x10;
      uVar64 = uVar67 ^ 0x10;
      local_c68 = uVar68 ^ 0x10;
      local_d20 = vshufps_avx(auVar70,auVar70,0);
      auVar124 = ZEXT1664(local_d20);
      local_b60._0_16_ = mm_lookupmask_ps._0_16_;
      local_b60._16_16_ = mm_lookupmask_ps._240_16_;
      local_d30 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
      auVar140 = ZEXT1664(local_d30);
      auVar81._8_4_ = 0x3f800000;
      auVar81._0_8_ = &DAT_3f8000003f800000;
      auVar81._12_4_ = 0x3f800000;
      auVar81._16_4_ = 0x3f800000;
      auVar81._20_4_ = 0x3f800000;
      auVar81._24_4_ = 0x3f800000;
      auVar81._28_4_ = 0x3f800000;
      auVar72._8_4_ = 0xbf800000;
      auVar72._0_8_ = 0xbf800000bf800000;
      auVar72._12_4_ = 0xbf800000;
      auVar72._16_4_ = 0xbf800000;
      auVar72._20_4_ = 0xbf800000;
      auVar72._24_4_ = 0xbf800000;
      auVar72._28_4_ = 0xbf800000;
      _local_b80 = vblendvps_avx(auVar81,auVar72,local_b60);
      uVar65 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_c90._4_4_ = uVar65;
      local_c90._0_4_ = uVar65;
      local_c90._8_4_ = uVar65;
      local_c90._12_4_ = uVar65;
      auVar110 = ZEXT1664(local_c90);
      local_d40 = uVar68;
      local_d38 = uVar67;
      do {
        if (local_d48 == &local_800) {
          return;
        }
        uVar62 = local_d48[-1];
        local_d48 = local_d48 + -1;
        do {
          if ((uVar62 & 8) == 0) {
            auVar71 = vsubps_avx(*(undefined1 (*) [16])(uVar62 + 0x20 + local_d50),auVar150._0_16_);
            auVar70._0_4_ = auVar159._0_4_ * auVar71._0_4_;
            auVar70._4_4_ = auVar159._4_4_ * auVar71._4_4_;
            auVar70._8_4_ = auVar159._8_4_ * auVar71._8_4_;
            auVar70._12_4_ = auVar159._12_4_ * auVar71._12_4_;
            auVar71 = vsubps_avx(*(undefined1 (*) [16])(uVar62 + 0x20 + uVar67),auVar157._0_16_);
            auVar74._0_4_ = auVar161._0_4_ * auVar71._0_4_;
            auVar74._4_4_ = auVar161._4_4_ * auVar71._4_4_;
            auVar74._8_4_ = auVar161._8_4_ * auVar71._8_4_;
            auVar74._12_4_ = auVar161._12_4_ * auVar71._12_4_;
            auVar71 = vmaxps_avx(auVar70,auVar74);
            auVar119 = vsubps_avx(*(undefined1 (*) [16])(uVar62 + 0x20 + uVar68),auVar110._0_16_);
            auVar75._0_4_ = auVar164._0_4_ * auVar119._0_4_;
            auVar75._4_4_ = auVar164._4_4_ * auVar119._4_4_;
            auVar75._8_4_ = auVar164._8_4_ * auVar119._8_4_;
            auVar75._12_4_ = auVar164._12_4_ * auVar119._12_4_;
            auVar119 = vmaxps_avx(auVar75,auVar124._0_16_);
            auVar71 = vmaxps_avx(auVar71,auVar119);
            auVar119 = vsubps_avx(*(undefined1 (*) [16])(uVar62 + 0x20 + uVar63),auVar150._0_16_);
            auVar76._0_4_ = auVar180._0_4_ * auVar119._0_4_;
            auVar76._4_4_ = auVar180._4_4_ * auVar119._4_4_;
            auVar76._8_4_ = auVar180._8_4_ * auVar119._8_4_;
            auVar76._12_4_ = auVar180._12_4_ * auVar119._12_4_;
            auVar119 = vsubps_avx(*(undefined1 (*) [16])(uVar62 + 0x20 + uVar64),auVar157._0_16_);
            auVar79._0_4_ = auVar194._0_4_ * auVar119._0_4_;
            auVar79._4_4_ = auVar194._4_4_ * auVar119._4_4_;
            auVar79._8_4_ = auVar194._8_4_ * auVar119._8_4_;
            auVar79._12_4_ = auVar194._12_4_ * auVar119._12_4_;
            auVar119 = vminps_avx(auVar76,auVar79);
            auVar70 = vsubps_avx(*(undefined1 (*) [16])(uVar62 + 0x20 + local_c68),auVar110._0_16_);
            auVar80._0_4_ = auVar196._0_4_ * auVar70._0_4_;
            auVar80._4_4_ = auVar196._4_4_ * auVar70._4_4_;
            auVar80._8_4_ = auVar196._8_4_ * auVar70._8_4_;
            auVar80._12_4_ = auVar196._12_4_ * auVar70._12_4_;
            auVar70 = vminps_avx(auVar80,auVar140._0_16_);
            auVar119 = vminps_avx(auVar119,auVar70);
            auVar71 = vcmpps_avx(auVar71,auVar119,2);
            uVar65 = vmovmskps_avx(auVar71);
            unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar65);
          }
          if ((uVar62 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar66 = 4;
            }
            else {
              uVar61 = uVar62 & 0xfffffffffffffff0;
              lVar59 = 0;
              if (unaff_R12 != 0) {
                for (; (unaff_R12 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                }
              }
              iVar66 = 0;
              uVar62 = *(ulong *)(uVar61 + lVar59 * 8);
              uVar60 = unaff_R12 - 1 & unaff_R12;
              if (uVar60 != 0) {
                *local_d48 = uVar62;
                lVar59 = 0;
                if (uVar60 != 0) {
                  for (; (uVar60 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                  }
                }
                uVar57 = uVar60 - 1;
                while( true ) {
                  local_d48 = local_d48 + 1;
                  uVar62 = *(ulong *)(uVar61 + lVar59 * 8);
                  uVar57 = uVar57 & uVar60;
                  if (uVar57 == 0) break;
                  *local_d48 = uVar62;
                  lVar59 = 0;
                  if (uVar57 != 0) {
                    for (; (uVar57 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                    }
                  }
                  uVar60 = uVar57 - 1;
                }
              }
            }
          }
          else {
            iVar66 = 6;
          }
        } while (iVar66 == 0);
        if (iVar66 == 6) {
          iVar66 = 0;
          local_c78 = (ulong)((uint)uVar62 & 0xf) - 8;
          bVar69 = local_c78 != 0;
          if (bVar69) {
            uVar62 = uVar62 & 0xfffffffffffffff0;
            pSVar3 = context->scene;
            local_c70 = 0;
            do {
              lVar58 = local_c70 * 0x60;
              ppfVar4 = (pSVar3->vertices).items;
              pfVar5 = ppfVar4[*(uint *)(uVar62 + 0x40 + lVar58)];
              pfVar6 = ppfVar4[*(uint *)(uVar62 + 0x44 + lVar58)];
              pfVar7 = ppfVar4[*(uint *)(uVar62 + 0x48 + lVar58)];
              pfVar8 = ppfVar4[*(uint *)(uVar62 + 0x4c + lVar58)];
              auVar70 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar62 + lVar58)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar62 + 8 + lVar58)));
              auVar71 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar62 + lVar58)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar62 + 8 + lVar58)));
              auVar92 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar62 + 4 + lVar58)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar62 + 0xc + lVar58)));
              auVar119 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar62 + 4 + lVar58)),
                                       *(undefined1 (*) [16])
                                        (pfVar8 + *(uint *)(uVar62 + 0xc + lVar58)));
              auVar120 = vunpcklps_avx(auVar71,auVar119);
              auVar121 = vunpcklps_avx(auVar70,auVar92);
              auVar71 = vunpckhps_avx(auVar70,auVar92);
              auVar92 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar62 + 0x10 + lVar58)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar62 + 0x18 + lVar58)));
              auVar119 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar62 + 0x10 + lVar58)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar62 + 0x18 + lVar58)));
              auVar106 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar62 + 0x14 + lVar58)),
                                       *(undefined1 (*) [16])
                                        (pfVar8 + *(uint *)(uVar62 + 0x1c + lVar58)));
              auVar70 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar62 + 0x14 + lVar58)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar62 + 0x1c + lVar58)));
              auVar74 = vunpcklps_avx(auVar119,auVar70);
              auVar75 = vunpcklps_avx(auVar92,auVar106);
              auVar119 = vunpckhps_avx(auVar92,auVar106);
              auVar106 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar62 + 0x20 + lVar58)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar62 + 0x28 + lVar58)));
              auVar70 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar62 + 0x20 + lVar58)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar62 + 0x28 + lVar58)));
              auVar76 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar62 + 0x24 + lVar58)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar62 + 0x2c + lVar58)));
              auVar92 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar62 + 0x24 + lVar58)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar62 + 0x2c + lVar58)));
              auVar79 = vunpcklps_avx(auVar70,auVar92);
              auVar80 = vunpcklps_avx(auVar106,auVar76);
              auVar70 = vunpckhps_avx(auVar106,auVar76);
              auVar76 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar62 + 0x30 + lVar58)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar62 + 0x38 + lVar58)));
              auVar92 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar62 + 0x30 + lVar58)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar62 + 0x38 + lVar58)));
              auVar26 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar62 + 0x34 + lVar58)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar62 + 0x3c + lVar58)));
              auVar106 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar62 + 0x34 + lVar58)),
                                       *(undefined1 (*) [16])
                                        (pfVar8 + *(uint *)(uVar62 + 0x3c + lVar58)));
              auVar106 = vunpcklps_avx(auVar92,auVar106);
              auVar27 = vunpcklps_avx(auVar76,auVar26);
              lVar59 = uVar62 + 0x40 + lVar58;
              local_9e0 = *(undefined8 *)(lVar59 + 0x10);
              uStack_9d8 = *(undefined8 *)(lVar59 + 0x18);
              auVar92 = vunpckhps_avx(auVar76,auVar26);
              uStack_9d0 = local_9e0;
              uStack_9c8 = uStack_9d8;
              lVar58 = uVar62 + 0x50 + lVar58;
              local_a00 = *(undefined8 *)(lVar58 + 0x10);
              uStack_9f8 = *(undefined8 *)(lVar58 + 0x18);
              uStack_9f0 = local_a00;
              uStack_9e8 = uStack_9f8;
              auVar199._16_16_ = auVar80;
              auVar199._0_16_ = auVar121;
              auVar148._16_16_ = auVar70;
              auVar148._0_16_ = auVar71;
              auVar73._16_16_ = auVar79;
              auVar73._0_16_ = auVar120;
              auVar107._16_16_ = auVar75;
              auVar107._0_16_ = auVar75;
              auVar122._16_16_ = auVar119;
              auVar122._0_16_ = auVar119;
              auVar77._16_16_ = auVar74;
              auVar77._0_16_ = auVar74;
              auVar158._16_16_ = auVar27;
              auVar158._0_16_ = auVar27;
              auVar160._16_16_ = auVar92;
              auVar160._0_16_ = auVar92;
              auVar93._16_16_ = auVar106;
              auVar93._0_16_ = auVar106;
              uVar65 = *(undefined4 *)&(ray->org).field_0;
              auVar179._4_4_ = uVar65;
              auVar179._0_4_ = uVar65;
              auVar179._8_4_ = uVar65;
              auVar179._12_4_ = uVar65;
              auVar179._16_4_ = uVar65;
              auVar179._20_4_ = uVar65;
              auVar179._24_4_ = uVar65;
              auVar179._28_4_ = uVar65;
              uVar65 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar193._4_4_ = uVar65;
              auVar193._0_4_ = uVar65;
              auVar193._8_4_ = uVar65;
              auVar193._12_4_ = uVar65;
              auVar193._16_4_ = uVar65;
              auVar193._20_4_ = uVar65;
              auVar193._24_4_ = uVar65;
              auVar193._28_4_ = uVar65;
              uVar65 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar195._4_4_ = uVar65;
              auVar195._0_4_ = uVar65;
              auVar195._8_4_ = uVar65;
              auVar195._12_4_ = uVar65;
              auVar195._16_4_ = uVar65;
              auVar195._20_4_ = uVar65;
              auVar195._24_4_ = uVar65;
              auVar195._28_4_ = uVar65;
              local_a20 = vsubps_avx(auVar199,auVar179);
              local_a40 = vsubps_avx(auVar148,auVar193);
              local_a60 = vsubps_avx(auVar73,auVar195);
              auVar72 = vsubps_avx(auVar107,auVar179);
              auVar81 = vsubps_avx(auVar122,auVar193);
              auVar19 = vsubps_avx(auVar77,auVar195);
              auVar73 = vsubps_avx(auVar158,auVar179);
              auVar20 = vsubps_avx(auVar160,auVar193);
              auVar21 = vsubps_avx(auVar93,auVar195);
              local_a80 = vsubps_avx(auVar73,local_a20);
              local_aa0 = vsubps_avx(auVar20,local_a40);
              local_ac0 = vsubps_avx(auVar21,local_a60);
              fVar197 = local_a40._0_4_;
              fVar105 = fVar197 + auVar20._0_4_;
              fVar200 = local_a40._4_4_;
              fVar111 = fVar200 + auVar20._4_4_;
              fVar202 = local_a40._8_4_;
              fVar112 = fVar202 + auVar20._8_4_;
              fVar204 = local_a40._12_4_;
              fVar113 = fVar204 + auVar20._12_4_;
              fVar206 = local_a40._16_4_;
              fVar114 = fVar206 + auVar20._16_4_;
              fVar208 = local_a40._20_4_;
              fVar115 = fVar208 + auVar20._20_4_;
              fVar210 = local_a40._24_4_;
              fVar116 = fVar210 + auVar20._24_4_;
              fVar85 = local_a40._28_4_;
              fVar1 = local_a60._0_4_;
              fVar117 = auVar21._0_4_ + fVar1;
              fVar12 = local_a60._4_4_;
              fVar125 = auVar21._4_4_ + fVar12;
              fVar14 = local_a60._8_4_;
              fVar127 = auVar21._8_4_ + fVar14;
              fVar16 = local_a60._12_4_;
              fVar129 = auVar21._12_4_ + fVar16;
              fVar84 = local_a60._16_4_;
              fVar131 = auVar21._16_4_ + fVar84;
              fVar88 = local_a60._20_4_;
              fVar133 = auVar21._20_4_ + fVar88;
              fVar17 = local_a60._24_4_;
              fVar135 = auVar21._24_4_ + fVar17;
              fVar137 = local_ac0._0_4_;
              fVar141 = local_ac0._4_4_;
              auVar22._4_4_ = fVar141 * fVar111;
              auVar22._0_4_ = fVar137 * fVar105;
              fVar142 = local_ac0._8_4_;
              auVar22._8_4_ = fVar142 * fVar112;
              fVar143 = local_ac0._12_4_;
              auVar22._12_4_ = fVar143 * fVar113;
              fVar144 = local_ac0._16_4_;
              auVar22._16_4_ = fVar144 * fVar114;
              fVar145 = local_ac0._20_4_;
              auVar22._20_4_ = fVar145 * fVar115;
              fVar146 = local_ac0._24_4_;
              auVar22._24_4_ = fVar146 * fVar116;
              auVar22._28_4_ = auVar70._12_4_;
              fVar177 = local_aa0._0_4_;
              fVar181 = local_aa0._4_4_;
              auVar23._4_4_ = fVar181 * fVar125;
              auVar23._0_4_ = fVar177 * fVar117;
              fVar183 = local_aa0._8_4_;
              auVar23._8_4_ = fVar183 * fVar127;
              fVar185 = local_aa0._12_4_;
              auVar23._12_4_ = fVar185 * fVar129;
              fVar187 = local_aa0._16_4_;
              auVar23._16_4_ = fVar187 * fVar131;
              fVar189 = local_aa0._20_4_;
              auVar23._20_4_ = fVar189 * fVar133;
              fVar191 = local_aa0._24_4_;
              auVar23._24_4_ = fVar191 * fVar135;
              auVar23._28_4_ = auVar27._12_4_;
              auVar22 = vsubps_avx(auVar23,auVar22);
              fVar11 = local_a20._0_4_;
              fVar147 = auVar73._0_4_ + fVar11;
              fVar13 = local_a20._4_4_;
              fVar151 = auVar73._4_4_ + fVar13;
              fVar15 = local_a20._8_4_;
              fVar152 = auVar73._8_4_ + fVar15;
              fVar83 = local_a20._12_4_;
              fVar153 = auVar73._12_4_ + fVar83;
              fVar86 = local_a20._16_4_;
              fVar154 = auVar73._16_4_ + fVar86;
              fVar90 = local_a20._20_4_;
              fVar155 = auVar73._20_4_ + fVar90;
              fVar18 = local_a20._24_4_;
              fVar156 = auVar73._24_4_ + fVar18;
              fVar91 = local_a80._0_4_;
              fVar97 = local_a80._4_4_;
              auVar24._4_4_ = fVar97 * fVar125;
              auVar24._0_4_ = fVar91 * fVar117;
              fVar98 = local_a80._8_4_;
              auVar24._8_4_ = fVar98 * fVar127;
              fVar99 = local_a80._12_4_;
              auVar24._12_4_ = fVar99 * fVar129;
              fVar100 = local_a80._16_4_;
              auVar24._16_4_ = fVar100 * fVar131;
              fVar101 = local_a80._20_4_;
              auVar24._20_4_ = fVar101 * fVar133;
              fVar103 = local_a80._24_4_;
              auVar24._24_4_ = fVar103 * fVar135;
              auVar24._28_4_ = auVar21._28_4_ + local_a60._28_4_;
              auVar25._4_4_ = fVar141 * fVar151;
              auVar25._0_4_ = fVar137 * fVar147;
              auVar25._8_4_ = fVar142 * fVar152;
              auVar25._12_4_ = fVar143 * fVar153;
              auVar25._16_4_ = fVar144 * fVar154;
              auVar25._20_4_ = fVar145 * fVar155;
              auVar25._24_4_ = fVar146 * fVar156;
              auVar25._28_4_ = auVar92._12_4_;
              auVar23 = vsubps_avx(auVar25,auVar24);
              auVar28._4_4_ = fVar181 * fVar151;
              auVar28._0_4_ = fVar177 * fVar147;
              auVar28._8_4_ = fVar183 * fVar152;
              auVar28._12_4_ = fVar185 * fVar153;
              auVar28._16_4_ = fVar187 * fVar154;
              auVar28._20_4_ = fVar189 * fVar155;
              auVar28._24_4_ = fVar191 * fVar156;
              auVar28._28_4_ = auVar73._28_4_ + local_a20._28_4_;
              auVar29._4_4_ = fVar97 * fVar111;
              auVar29._0_4_ = fVar91 * fVar105;
              auVar29._8_4_ = fVar98 * fVar112;
              auVar29._12_4_ = fVar99 * fVar113;
              auVar29._16_4_ = fVar100 * fVar114;
              auVar29._20_4_ = fVar101 * fVar115;
              auVar29._24_4_ = fVar103 * fVar116;
              auVar29._28_4_ = fVar85 + auVar20._28_4_;
              auVar24 = vsubps_avx(auVar29,auVar28);
              fStack_bbc = (ray->dir).field_0.m128[1];
              local_c00._4_4_ = (ray->dir).field_0.m128[2];
              local_be0._4_4_ = (ray->dir).field_0.m128[0];
              local_ba0._0_4_ =
                   local_be0._4_4_ * auVar22._0_4_ +
                   fStack_bbc * auVar23._0_4_ + local_c00._4_4_ * auVar24._0_4_;
              local_ba0._4_4_ =
                   local_be0._4_4_ * auVar22._4_4_ +
                   fStack_bbc * auVar23._4_4_ + local_c00._4_4_ * auVar24._4_4_;
              local_ba0._8_4_ =
                   local_be0._4_4_ * auVar22._8_4_ +
                   fStack_bbc * auVar23._8_4_ + local_c00._4_4_ * auVar24._8_4_;
              local_ba0._12_4_ =
                   local_be0._4_4_ * auVar22._12_4_ +
                   fStack_bbc * auVar23._12_4_ + local_c00._4_4_ * auVar24._12_4_;
              local_ba0._16_4_ =
                   local_be0._4_4_ * auVar22._16_4_ +
                   fStack_bbc * auVar23._16_4_ + local_c00._4_4_ * auVar24._16_4_;
              local_ba0._20_4_ =
                   local_be0._4_4_ * auVar22._20_4_ +
                   fStack_bbc * auVar23._20_4_ + local_c00._4_4_ * auVar24._20_4_;
              local_ba0._24_4_ =
                   local_be0._4_4_ * auVar22._24_4_ +
                   fStack_bbc * auVar23._24_4_ + local_c00._4_4_ * auVar24._24_4_;
              local_ba0._28_4_ = auVar23._28_4_ + auVar23._28_4_ + auVar24._28_4_;
              auVar22 = vsubps_avx(local_a40,auVar81);
              local_ae0 = vsubps_avx(local_a60,auVar19);
              fVar112 = fVar197 + auVar81._0_4_;
              fVar113 = fVar200 + auVar81._4_4_;
              fVar114 = fVar202 + auVar81._8_4_;
              fVar115 = fVar204 + auVar81._12_4_;
              fVar116 = fVar206 + auVar81._16_4_;
              fVar117 = fVar208 + auVar81._20_4_;
              fVar125 = fVar210 + auVar81._24_4_;
              fVar105 = auVar81._28_4_;
              fVar127 = fVar1 + auVar19._0_4_;
              fVar129 = fVar12 + auVar19._4_4_;
              fVar131 = fVar14 + auVar19._8_4_;
              fVar133 = fVar16 + auVar19._12_4_;
              fVar135 = fVar84 + auVar19._16_4_;
              fVar147 = fVar88 + auVar19._20_4_;
              fVar151 = fVar17 + auVar19._24_4_;
              fVar111 = auVar19._28_4_;
              fVar178 = local_ae0._0_4_;
              fVar182 = local_ae0._4_4_;
              auVar30._4_4_ = fVar182 * fVar113;
              auVar30._0_4_ = fVar178 * fVar112;
              fVar184 = local_ae0._8_4_;
              auVar30._8_4_ = fVar184 * fVar114;
              fVar186 = local_ae0._12_4_;
              auVar30._12_4_ = fVar186 * fVar115;
              fVar188 = local_ae0._16_4_;
              auVar30._16_4_ = fVar188 * fVar116;
              fVar190 = local_ae0._20_4_;
              auVar30._20_4_ = fVar190 * fVar117;
              fVar192 = local_ae0._24_4_;
              auVar30._24_4_ = fVar192 * fVar125;
              auVar30._28_4_ = fVar85;
              fVar162 = auVar22._0_4_;
              fVar165 = auVar22._4_4_;
              auVar31._4_4_ = fVar165 * fVar129;
              auVar31._0_4_ = fVar162 * fVar127;
              fVar167 = auVar22._8_4_;
              auVar31._8_4_ = fVar167 * fVar131;
              fVar169 = auVar22._12_4_;
              auVar31._12_4_ = fVar169 * fVar133;
              fVar171 = auVar22._16_4_;
              auVar31._16_4_ = fVar171 * fVar135;
              fVar173 = auVar22._20_4_;
              auVar31._20_4_ = fVar173 * fVar147;
              fVar175 = auVar22._24_4_;
              auVar31._24_4_ = fVar175 * fVar151;
              auVar31._28_4_ = fVar111;
              auVar23 = vsubps_avx(auVar31,auVar30);
              auVar24 = vsubps_avx(local_a20,auVar72);
              fVar198 = auVar24._0_4_;
              fVar201 = auVar24._4_4_;
              auVar32._4_4_ = fVar201 * fVar129;
              auVar32._0_4_ = fVar198 * fVar127;
              fVar203 = auVar24._8_4_;
              auVar32._8_4_ = fVar203 * fVar131;
              fVar205 = auVar24._12_4_;
              auVar32._12_4_ = fVar205 * fVar133;
              fVar207 = auVar24._16_4_;
              auVar32._16_4_ = fVar207 * fVar135;
              fVar209 = auVar24._20_4_;
              auVar32._20_4_ = fVar209 * fVar147;
              fVar211 = auVar24._24_4_;
              auVar32._24_4_ = fVar211 * fVar151;
              auVar32._28_4_ = local_a60._28_4_ + fVar111;
              fVar127 = fVar11 + auVar72._0_4_;
              fVar129 = fVar13 + auVar72._4_4_;
              fVar131 = fVar15 + auVar72._8_4_;
              fVar133 = fVar83 + auVar72._12_4_;
              fVar135 = fVar86 + auVar72._16_4_;
              fVar147 = fVar90 + auVar72._20_4_;
              fVar151 = fVar18 + auVar72._24_4_;
              auVar33._4_4_ = fVar182 * fVar129;
              auVar33._0_4_ = fVar178 * fVar127;
              auVar33._8_4_ = fVar184 * fVar131;
              auVar33._12_4_ = fVar186 * fVar133;
              auVar33._16_4_ = fVar188 * fVar135;
              auVar33._20_4_ = fVar190 * fVar147;
              auVar33._24_4_ = fVar192 * fVar151;
              auVar33._28_4_ = local_ae0._28_4_;
              auVar24 = vsubps_avx(auVar33,auVar32);
              auVar34._4_4_ = fVar165 * fVar129;
              auVar34._0_4_ = fVar162 * fVar127;
              auVar34._8_4_ = fVar167 * fVar131;
              auVar34._12_4_ = fVar169 * fVar133;
              auVar34._16_4_ = fVar171 * fVar135;
              auVar34._20_4_ = fVar173 * fVar147;
              auVar34._24_4_ = fVar175 * fVar151;
              auVar34._28_4_ = local_a20._28_4_ + auVar72._28_4_;
              auVar35._4_4_ = fVar201 * fVar113;
              auVar35._0_4_ = fVar198 * fVar112;
              auVar35._8_4_ = fVar203 * fVar114;
              auVar35._12_4_ = fVar205 * fVar115;
              auVar35._16_4_ = fVar207 * fVar116;
              auVar35._20_4_ = fVar209 * fVar117;
              auVar35._24_4_ = fVar211 * fVar125;
              auVar35._28_4_ = fVar85 + fVar105;
              auVar25 = vsubps_avx(auVar35,auVar34);
              local_b00._0_4_ =
                   local_be0._4_4_ * auVar23._0_4_ +
                   fStack_bbc * auVar24._0_4_ + local_c00._4_4_ * auVar25._0_4_;
              local_b00._4_4_ =
                   local_be0._4_4_ * auVar23._4_4_ +
                   fStack_bbc * auVar24._4_4_ + local_c00._4_4_ * auVar25._4_4_;
              local_b00._8_4_ =
                   local_be0._4_4_ * auVar23._8_4_ +
                   fStack_bbc * auVar24._8_4_ + local_c00._4_4_ * auVar25._8_4_;
              local_b00._12_4_ =
                   local_be0._4_4_ * auVar23._12_4_ +
                   fStack_bbc * auVar24._12_4_ + local_c00._4_4_ * auVar25._12_4_;
              local_b00._16_4_ =
                   local_be0._4_4_ * auVar23._16_4_ +
                   fStack_bbc * auVar24._16_4_ + local_c00._4_4_ * auVar25._16_4_;
              local_b00._20_4_ =
                   local_be0._4_4_ * auVar23._20_4_ +
                   fStack_bbc * auVar24._20_4_ + local_c00._4_4_ * auVar25._20_4_;
              local_b00._24_4_ =
                   local_be0._4_4_ * auVar23._24_4_ +
                   fStack_bbc * auVar24._24_4_ + local_c00._4_4_ * auVar25._24_4_;
              local_b00._28_4_ = auVar23._28_4_ + auVar24._28_4_ + auVar25._28_4_;
              auVar23 = vsubps_avx(auVar72,auVar73);
              fVar152 = auVar72._0_4_ + auVar73._0_4_;
              fVar153 = auVar72._4_4_ + auVar73._4_4_;
              fVar154 = auVar72._8_4_ + auVar73._8_4_;
              fVar155 = auVar72._12_4_ + auVar73._12_4_;
              fVar156 = auVar72._16_4_ + auVar73._16_4_;
              fVar85 = auVar72._20_4_ + auVar73._20_4_;
              fVar87 = auVar72._24_4_ + auVar73._24_4_;
              fVar89 = auVar72._28_4_ + auVar73._28_4_;
              auVar72 = vsubps_avx(auVar81,auVar20);
              fVar127 = auVar81._0_4_ + auVar20._0_4_;
              fVar129 = auVar81._4_4_ + auVar20._4_4_;
              fVar131 = auVar81._8_4_ + auVar20._8_4_;
              fVar133 = auVar81._12_4_ + auVar20._12_4_;
              fVar135 = auVar81._16_4_ + auVar20._16_4_;
              fVar147 = auVar81._20_4_ + auVar20._20_4_;
              fVar151 = auVar81._24_4_ + auVar20._24_4_;
              auVar73 = vsubps_avx(auVar19,auVar21);
              fVar114 = auVar21._0_4_ + auVar19._0_4_;
              fVar115 = auVar21._4_4_ + auVar19._4_4_;
              fVar116 = auVar21._8_4_ + auVar19._8_4_;
              fVar117 = auVar21._12_4_ + auVar19._12_4_;
              fVar125 = auVar21._16_4_ + auVar19._16_4_;
              fVar102 = auVar21._20_4_ + auVar19._20_4_;
              fVar104 = auVar21._24_4_ + auVar19._24_4_;
              fVar118 = auVar73._0_4_;
              fVar126 = auVar73._4_4_;
              auVar19._4_4_ = fVar126 * fVar129;
              auVar19._0_4_ = fVar118 * fVar127;
              fVar128 = auVar73._8_4_;
              auVar19._8_4_ = fVar128 * fVar131;
              fVar130 = auVar73._12_4_;
              auVar19._12_4_ = fVar130 * fVar133;
              fVar132 = auVar73._16_4_;
              auVar19._16_4_ = fVar132 * fVar135;
              fVar134 = auVar73._20_4_;
              auVar19._20_4_ = fVar134 * fVar147;
              fVar136 = auVar73._24_4_;
              auVar19._24_4_ = fVar136 * fVar151;
              auVar19._28_4_ = auVar23._28_4_;
              fVar163 = auVar72._0_4_;
              fVar166 = auVar72._4_4_;
              auVar36._4_4_ = fVar166 * fVar115;
              auVar36._0_4_ = fVar163 * fVar114;
              fVar168 = auVar72._8_4_;
              auVar36._8_4_ = fVar168 * fVar116;
              fVar170 = auVar72._12_4_;
              auVar36._12_4_ = fVar170 * fVar117;
              fVar172 = auVar72._16_4_;
              auVar36._16_4_ = fVar172 * fVar125;
              fVar174 = auVar72._20_4_;
              auVar36._20_4_ = fVar174 * fVar102;
              fVar176 = auVar72._24_4_;
              auVar36._24_4_ = fVar176 * fVar104;
              auVar36._28_4_ = fVar105;
              auVar72 = vsubps_avx(auVar36,auVar19);
              fVar112 = auVar23._0_4_;
              fVar113 = auVar23._4_4_;
              auVar37._4_4_ = fVar113 * fVar115;
              auVar37._0_4_ = fVar112 * fVar114;
              fVar114 = auVar23._8_4_;
              auVar37._8_4_ = fVar114 * fVar116;
              fVar115 = auVar23._12_4_;
              auVar37._12_4_ = fVar115 * fVar117;
              fVar116 = auVar23._16_4_;
              auVar37._16_4_ = fVar116 * fVar125;
              fVar117 = auVar23._20_4_;
              auVar37._20_4_ = fVar117 * fVar102;
              fVar125 = auVar23._24_4_;
              auVar37._24_4_ = fVar125 * fVar104;
              auVar37._28_4_ = auVar21._28_4_ + fVar111;
              auVar21._4_4_ = fVar126 * fVar153;
              auVar21._0_4_ = fVar118 * fVar152;
              auVar21._8_4_ = fVar128 * fVar154;
              auVar21._12_4_ = fVar130 * fVar155;
              auVar21._16_4_ = fVar132 * fVar156;
              auVar21._20_4_ = fVar134 * fVar85;
              auVar21._24_4_ = fVar136 * fVar87;
              auVar21._28_4_ = fVar105;
              auVar81 = vsubps_avx(auVar21,auVar37);
              auVar38._4_4_ = fVar166 * fVar153;
              auVar38._0_4_ = fVar163 * fVar152;
              auVar38._8_4_ = fVar168 * fVar154;
              auVar38._12_4_ = fVar170 * fVar155;
              auVar38._16_4_ = fVar172 * fVar156;
              auVar38._20_4_ = fVar174 * fVar85;
              auVar38._24_4_ = fVar176 * fVar87;
              auVar38._28_4_ = fVar89;
              auVar39._4_4_ = fVar113 * fVar129;
              auVar39._0_4_ = fVar112 * fVar127;
              auVar39._8_4_ = fVar114 * fVar131;
              auVar39._12_4_ = fVar115 * fVar133;
              auVar39._16_4_ = fVar116 * fVar135;
              auVar39._20_4_ = fVar117 * fVar147;
              auVar39._24_4_ = fVar125 * fVar151;
              auVar39._28_4_ = fVar105 + auVar20._28_4_;
              auVar19 = vsubps_avx(auVar39,auVar38);
              local_c00._0_4_ = local_c00._4_4_;
              fStack_bf8 = local_c00._4_4_;
              fStack_bf4 = local_c00._4_4_;
              fStack_bf0 = local_c00._4_4_;
              fStack_bec = local_c00._4_4_;
              fStack_be8 = local_c00._4_4_;
              fStack_be4 = local_c00._4_4_;
              local_bc0 = fStack_bbc;
              fStack_bb8 = fStack_bbc;
              fStack_bb4 = fStack_bbc;
              fStack_bb0 = fStack_bbc;
              fStack_bac = fStack_bbc;
              fStack_ba8 = fStack_bbc;
              fStack_ba4 = fStack_bbc;
              local_be0._0_4_ = local_be0._4_4_;
              fStack_bd8 = local_be0._4_4_;
              fStack_bd4 = local_be0._4_4_;
              fStack_bd0 = local_be0._4_4_;
              fStack_bcc = local_be0._4_4_;
              fStack_bc8 = local_be0._4_4_;
              fStack_bc4 = local_be0._4_4_;
              auVar78._0_4_ =
                   local_be0._4_4_ * auVar72._0_4_ +
                   fStack_bbc * auVar81._0_4_ + local_c00._4_4_ * auVar19._0_4_;
              auVar78._4_4_ =
                   local_be0._4_4_ * auVar72._4_4_ +
                   fStack_bbc * auVar81._4_4_ + local_c00._4_4_ * auVar19._4_4_;
              auVar78._8_4_ =
                   local_be0._4_4_ * auVar72._8_4_ +
                   fStack_bbc * auVar81._8_4_ + local_c00._4_4_ * auVar19._8_4_;
              auVar78._12_4_ =
                   local_be0._4_4_ * auVar72._12_4_ +
                   fStack_bbc * auVar81._12_4_ + local_c00._4_4_ * auVar19._12_4_;
              auVar78._16_4_ =
                   local_be0._4_4_ * auVar72._16_4_ +
                   fStack_bbc * auVar81._16_4_ + local_c00._4_4_ * auVar19._16_4_;
              auVar78._20_4_ =
                   local_be0._4_4_ * auVar72._20_4_ +
                   fStack_bbc * auVar81._20_4_ + local_c00._4_4_ * auVar19._20_4_;
              auVar78._24_4_ =
                   local_be0._4_4_ * auVar72._24_4_ +
                   fStack_bbc * auVar81._24_4_ + local_c00._4_4_ * auVar19._24_4_;
              auVar78._28_4_ = fVar89 + fVar89 + auVar19._28_4_;
              local_b40._0_4_ = auVar78._0_4_ + local_ba0._0_4_ + local_b00._0_4_;
              local_b40._4_4_ = auVar78._4_4_ + local_ba0._4_4_ + local_b00._4_4_;
              local_b40._8_4_ = auVar78._8_4_ + local_ba0._8_4_ + local_b00._8_4_;
              local_b40._12_4_ = auVar78._12_4_ + local_ba0._12_4_ + local_b00._12_4_;
              local_b40._16_4_ = auVar78._16_4_ + local_ba0._16_4_ + local_b00._16_4_;
              local_b40._20_4_ = auVar78._20_4_ + local_ba0._20_4_ + local_b00._20_4_;
              local_b40._24_4_ = auVar78._24_4_ + local_ba0._24_4_ + local_b00._24_4_;
              local_b40._28_4_ = auVar78._28_4_ + local_ba0._28_4_ + local_b00._28_4_;
              auVar72 = vminps_avx(local_ba0,local_b00);
              auVar72 = vminps_avx(auVar72,auVar78);
              auVar94._8_4_ = 0x7fffffff;
              auVar94._0_8_ = 0x7fffffff7fffffff;
              auVar94._12_4_ = 0x7fffffff;
              auVar94._16_4_ = 0x7fffffff;
              auVar94._20_4_ = 0x7fffffff;
              auVar94._24_4_ = 0x7fffffff;
              auVar94._28_4_ = 0x7fffffff;
              local_b20 = vandps_avx(local_b40,auVar94);
              fVar105 = local_b20._0_4_ * 1.1920929e-07;
              fVar111 = local_b20._4_4_ * 1.1920929e-07;
              auVar20._4_4_ = fVar111;
              auVar20._0_4_ = fVar105;
              fVar127 = local_b20._8_4_ * 1.1920929e-07;
              auVar20._8_4_ = fVar127;
              fVar129 = local_b20._12_4_ * 1.1920929e-07;
              auVar20._12_4_ = fVar129;
              fVar131 = local_b20._16_4_ * 1.1920929e-07;
              auVar20._16_4_ = fVar131;
              fVar133 = local_b20._20_4_ * 1.1920929e-07;
              auVar20._20_4_ = fVar133;
              fVar135 = local_b20._24_4_ * 1.1920929e-07;
              auVar20._24_4_ = fVar135;
              auVar20._28_4_ = 0x34000000;
              auVar149._0_8_ = CONCAT44(fVar111,fVar105) ^ 0x8000000080000000;
              auVar149._8_4_ = -fVar127;
              auVar149._12_4_ = -fVar129;
              auVar149._16_4_ = -fVar131;
              auVar149._20_4_ = -fVar133;
              auVar149._24_4_ = -fVar135;
              auVar149._28_4_ = 0xb4000000;
              auVar72 = vcmpps_avx(auVar72,auVar149,5);
              auVar19 = vmaxps_avx(local_ba0,local_b00);
              auVar81 = vmaxps_avx(auVar19,auVar78);
              auVar81 = vcmpps_avx(auVar81,auVar20,2);
              auVar81 = vorps_avx(auVar72,auVar81);
              if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar81 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar81 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar81 >> 0x7f,0) == '\0') &&
                    (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar81 >> 0xbf,0) == '\0') &&
                  (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar81[0x1f]) {
LAB_002de506:
                auVar150 = ZEXT1664(local_ca0);
                auVar157 = ZEXT1664(local_cb0);
                auVar159 = ZEXT1664(local_cc0);
                auVar161 = ZEXT1664(local_cd0);
                auVar164 = ZEXT1664(local_ce0);
                auVar180 = ZEXT1664(local_cf0);
                auVar194 = ZEXT1664(local_d00);
                auVar196 = ZEXT1664(local_d10);
                auVar124 = ZEXT1664(local_d20);
                auVar140 = ZEXT1664(local_d30);
                auVar110 = ZEXT1664(local_c90);
              }
              else {
                auVar40._4_4_ = fVar165 * fVar141;
                auVar40._0_4_ = fVar162 * fVar137;
                auVar40._8_4_ = fVar167 * fVar142;
                auVar40._12_4_ = fVar169 * fVar143;
                auVar40._16_4_ = fVar171 * fVar144;
                auVar40._20_4_ = fVar173 * fVar145;
                auVar40._24_4_ = fVar175 * fVar146;
                auVar40._28_4_ = auVar72._28_4_;
                auVar41._4_4_ = fVar181 * fVar182;
                auVar41._0_4_ = fVar177 * fVar178;
                auVar41._8_4_ = fVar183 * fVar184;
                auVar41._12_4_ = fVar185 * fVar186;
                auVar41._16_4_ = fVar187 * fVar188;
                auVar41._20_4_ = fVar189 * fVar190;
                auVar41._24_4_ = fVar191 * fVar192;
                auVar41._28_4_ = 0x34000000;
                auVar20 = vsubps_avx(auVar41,auVar40);
                auVar42._4_4_ = fVar182 * fVar166;
                auVar42._0_4_ = fVar178 * fVar163;
                auVar42._8_4_ = fVar184 * fVar168;
                auVar42._12_4_ = fVar186 * fVar170;
                auVar42._16_4_ = fVar188 * fVar172;
                auVar42._20_4_ = fVar190 * fVar174;
                auVar42._24_4_ = fVar192 * fVar176;
                auVar42._28_4_ = auVar19._28_4_;
                auVar43._4_4_ = fVar165 * fVar126;
                auVar43._0_4_ = fVar162 * fVar118;
                auVar43._8_4_ = fVar167 * fVar128;
                auVar43._12_4_ = fVar169 * fVar130;
                auVar43._16_4_ = fVar171 * fVar132;
                auVar43._20_4_ = fVar173 * fVar134;
                auVar43._24_4_ = fVar175 * fVar136;
                auVar43._28_4_ = auVar22._28_4_;
                auVar21 = vsubps_avx(auVar43,auVar42);
                auVar108._8_4_ = 0x7fffffff;
                auVar108._0_8_ = 0x7fffffff7fffffff;
                auVar108._12_4_ = 0x7fffffff;
                auVar108._16_4_ = 0x7fffffff;
                auVar108._20_4_ = 0x7fffffff;
                auVar108._24_4_ = 0x7fffffff;
                auVar108._28_4_ = 0x7fffffff;
                auVar72 = vandps_avx(auVar40,auVar108);
                auVar19 = vandps_avx(auVar42,auVar108);
                auVar72 = vcmpps_avx(auVar72,auVar19,1);
                local_960 = vblendvps_avx(auVar21,auVar20,auVar72);
                auVar44._4_4_ = fVar201 * fVar126;
                auVar44._0_4_ = fVar198 * fVar118;
                auVar44._8_4_ = fVar203 * fVar128;
                auVar44._12_4_ = fVar205 * fVar130;
                auVar44._16_4_ = fVar207 * fVar132;
                auVar44._20_4_ = fVar209 * fVar134;
                auVar44._24_4_ = fVar211 * fVar136;
                auVar44._28_4_ = auVar72._28_4_;
                auVar45._4_4_ = fVar201 * fVar141;
                auVar45._0_4_ = fVar198 * fVar137;
                auVar45._8_4_ = fVar203 * fVar142;
                auVar45._12_4_ = fVar205 * fVar143;
                auVar45._16_4_ = fVar207 * fVar144;
                auVar45._20_4_ = fVar209 * fVar145;
                auVar45._24_4_ = fVar211 * fVar146;
                auVar45._28_4_ = auVar20._28_4_;
                auVar46._4_4_ = fVar97 * fVar182;
                auVar46._0_4_ = fVar91 * fVar178;
                auVar46._8_4_ = fVar98 * fVar184;
                auVar46._12_4_ = fVar99 * fVar186;
                auVar46._16_4_ = fVar100 * fVar188;
                auVar46._20_4_ = fVar101 * fVar190;
                auVar46._24_4_ = fVar103 * fVar192;
                auVar46._28_4_ = local_ac0._28_4_;
                auVar20 = vsubps_avx(auVar45,auVar46);
                auVar47._4_4_ = fVar182 * fVar113;
                auVar47._0_4_ = fVar178 * fVar112;
                auVar47._8_4_ = fVar184 * fVar114;
                auVar47._12_4_ = fVar186 * fVar115;
                auVar47._16_4_ = fVar188 * fVar116;
                auVar47._20_4_ = fVar190 * fVar117;
                auVar47._24_4_ = fVar192 * fVar125;
                auVar47._28_4_ = auVar19._28_4_;
                auVar21 = vsubps_avx(auVar47,auVar44);
                auVar72 = vandps_avx(auVar46,auVar108);
                auVar19 = vandps_avx(auVar44,auVar108);
                auVar72 = vcmpps_avx(auVar72,auVar19,1);
                local_940 = vblendvps_avx(auVar21,auVar20,auVar72);
                auVar48._4_4_ = fVar165 * fVar113;
                auVar48._0_4_ = fVar162 * fVar112;
                auVar48._8_4_ = fVar167 * fVar114;
                auVar48._12_4_ = fVar169 * fVar115;
                auVar48._16_4_ = fVar171 * fVar116;
                auVar48._20_4_ = fVar173 * fVar117;
                auVar48._24_4_ = fVar175 * fVar125;
                auVar48._28_4_ = auVar72._28_4_;
                auVar49._4_4_ = fVar97 * fVar165;
                auVar49._0_4_ = fVar91 * fVar162;
                auVar49._8_4_ = fVar98 * fVar167;
                auVar49._12_4_ = fVar99 * fVar169;
                auVar49._16_4_ = fVar100 * fVar171;
                auVar49._20_4_ = fVar101 * fVar173;
                auVar49._24_4_ = fVar103 * fVar175;
                auVar49._28_4_ = auVar20._28_4_;
                auVar50._4_4_ = fVar181 * fVar201;
                auVar50._0_4_ = fVar177 * fVar198;
                auVar50._8_4_ = fVar183 * fVar203;
                auVar50._12_4_ = fVar185 * fVar205;
                auVar50._16_4_ = fVar187 * fVar207;
                auVar50._20_4_ = fVar189 * fVar209;
                auVar50._24_4_ = fVar191 * fVar211;
                auVar50._28_4_ = auVar73._28_4_;
                auVar51._4_4_ = fVar201 * fVar166;
                auVar51._0_4_ = fVar198 * fVar163;
                auVar51._8_4_ = fVar203 * fVar168;
                auVar51._12_4_ = fVar205 * fVar170;
                auVar51._16_4_ = fVar207 * fVar172;
                auVar51._20_4_ = fVar209 * fVar174;
                auVar51._24_4_ = fVar211 * fVar176;
                auVar51._28_4_ = auVar23._28_4_;
                auVar73 = vsubps_avx(auVar49,auVar50);
                auVar20 = vsubps_avx(auVar51,auVar48);
                auVar72 = vandps_avx(auVar50,auVar108);
                auVar19 = vandps_avx(auVar48,auVar108);
                auVar19 = vcmpps_avx(auVar72,auVar19,1);
                local_920 = vblendvps_avx(auVar20,auVar73,auVar19);
                auVar71 = vpackssdw_avx(auVar81._0_16_,auVar81._16_16_);
                fVar111 = local_920._0_4_;
                fVar112 = local_920._4_4_;
                fVar113 = local_920._8_4_;
                fVar114 = local_920._12_4_;
                fVar115 = local_920._16_4_;
                fVar116 = local_920._20_4_;
                fVar117 = local_920._24_4_;
                fVar151 = local_940._0_4_;
                fVar152 = local_940._4_4_;
                fVar153 = local_940._8_4_;
                fVar154 = local_940._12_4_;
                fVar155 = local_940._16_4_;
                fVar156 = local_940._20_4_;
                fVar85 = local_940._24_4_;
                fVar87 = local_960._0_4_;
                fVar89 = local_960._4_4_;
                fVar91 = local_960._8_4_;
                fVar97 = local_960._12_4_;
                fVar98 = local_960._16_4_;
                fVar99 = local_960._20_4_;
                fVar100 = local_960._24_4_;
                fVar105 = fVar87 * local_be0._4_4_ +
                          fVar151 * fStack_bbc + fVar111 * local_c00._4_4_;
                fVar125 = fVar89 * local_be0._4_4_ +
                          fVar152 * fStack_bbc + fVar112 * local_c00._4_4_;
                fVar127 = fVar91 * local_be0._4_4_ +
                          fVar153 * fStack_bbc + fVar113 * local_c00._4_4_;
                fVar129 = fVar97 * local_be0._4_4_ +
                          fVar154 * fStack_bbc + fVar114 * local_c00._4_4_;
                fVar131 = fVar98 * local_be0._4_4_ +
                          fVar155 * fStack_bbc + fVar115 * local_c00._4_4_;
                fVar133 = fVar99 * local_be0._4_4_ +
                          fVar156 * fStack_bbc + fVar116 * local_c00._4_4_;
                fVar135 = fVar100 * local_be0._4_4_ +
                          fVar85 * fStack_bbc + fVar117 * local_c00._4_4_;
                fVar147 = auVar73._28_4_ + auVar73._28_4_ + 0.0;
                auVar95._0_4_ = fVar105 + fVar105;
                auVar95._4_4_ = fVar125 + fVar125;
                auVar95._8_4_ = fVar127 + fVar127;
                auVar95._12_4_ = fVar129 + fVar129;
                auVar95._16_4_ = fVar131 + fVar131;
                auVar95._20_4_ = fVar133 + fVar133;
                auVar95._24_4_ = fVar135 + fVar135;
                auVar95._28_4_ = fVar147 + fVar147;
                fVar105 = auVar72._28_4_;
                auVar72 = vrcpps_avx(auVar95);
                fVar125 = fVar87 * fVar11 + fVar151 * fVar197 + fVar111 * fVar1;
                fVar127 = fVar89 * fVar13 + fVar152 * fVar200 + fVar112 * fVar12;
                fVar129 = fVar91 * fVar15 + fVar153 * fVar202 + fVar113 * fVar14;
                fVar83 = fVar97 * fVar83 + fVar154 * fVar204 + fVar114 * fVar16;
                fVar84 = fVar98 * fVar86 + fVar155 * fVar206 + fVar115 * fVar84;
                fVar86 = fVar99 * fVar90 + fVar156 * fVar208 + fVar116 * fVar88;
                fVar88 = fVar100 * fVar18 + fVar85 * fVar210 + fVar117 * fVar17;
                fVar90 = fVar105 + fVar105 + fVar147;
                fVar1 = auVar72._0_4_;
                fVar11 = auVar72._4_4_;
                auVar52._4_4_ = auVar95._4_4_ * fVar11;
                auVar52._0_4_ = auVar95._0_4_ * fVar1;
                fVar12 = auVar72._8_4_;
                auVar52._8_4_ = auVar95._8_4_ * fVar12;
                fVar13 = auVar72._12_4_;
                auVar52._12_4_ = auVar95._12_4_ * fVar13;
                fVar14 = auVar72._16_4_;
                auVar52._16_4_ = auVar95._16_4_ * fVar14;
                fVar15 = auVar72._20_4_;
                auVar52._20_4_ = auVar95._20_4_ * fVar15;
                fVar16 = auVar72._24_4_;
                auVar52._24_4_ = auVar95._24_4_ * fVar16;
                auVar52._28_4_ = fVar105;
                auVar109._8_4_ = 0x3f800000;
                auVar109._0_8_ = &DAT_3f8000003f800000;
                auVar109._12_4_ = 0x3f800000;
                auVar109._16_4_ = 0x3f800000;
                auVar109._20_4_ = 0x3f800000;
                auVar109._24_4_ = 0x3f800000;
                auVar109._28_4_ = 0x3f800000;
                auVar72 = vsubps_avx(auVar109,auVar52);
                uVar65 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar138._4_4_ = uVar65;
                auVar138._0_4_ = uVar65;
                auVar138._8_4_ = uVar65;
                auVar138._12_4_ = uVar65;
                auVar138._16_4_ = uVar65;
                auVar138._20_4_ = uVar65;
                auVar138._24_4_ = uVar65;
                auVar138._28_4_ = uVar65;
                local_8a0._4_4_ = (fVar127 + fVar127) * (fVar11 + fVar11 * auVar72._4_4_);
                local_8a0._0_4_ = (fVar125 + fVar125) * (fVar1 + fVar1 * auVar72._0_4_);
                local_8a0._8_4_ = (fVar129 + fVar129) * (fVar12 + fVar12 * auVar72._8_4_);
                local_8a0._12_4_ = (fVar83 + fVar83) * (fVar13 + fVar13 * auVar72._12_4_);
                local_8a0._16_4_ = (fVar84 + fVar84) * (fVar14 + fVar14 * auVar72._16_4_);
                local_8a0._20_4_ = (fVar86 + fVar86) * (fVar15 + fVar15 * auVar72._20_4_);
                local_8a0._24_4_ = (fVar88 + fVar88) * (fVar16 + fVar16 * auVar72._24_4_);
                local_8a0._28_4_ = fVar90 + fVar90;
                auVar72 = vcmpps_avx(auVar138,local_8a0,2);
                fVar1 = ray->tfar;
                auVar139._4_4_ = fVar1;
                auVar139._0_4_ = fVar1;
                auVar139._8_4_ = fVar1;
                auVar139._12_4_ = fVar1;
                auVar139._16_4_ = fVar1;
                auVar139._20_4_ = fVar1;
                auVar139._24_4_ = fVar1;
                auVar139._28_4_ = fVar1;
                auVar81 = vcmpps_avx(local_8a0,auVar139,2);
                auVar72 = vandps_avx(auVar81,auVar72);
                auVar81 = vcmpps_avx(auVar95,_DAT_02020f00,4);
                auVar72 = vandps_avx(auVar72,auVar81);
                auVar119 = vpackssdw_avx(auVar72._0_16_,auVar72._16_16_);
                auVar71 = vpand_avx(auVar119,auVar71);
                auVar119 = vpmovsxwd_avx(auVar71);
                auVar70 = vpshufd_avx(auVar71,0xee);
                auVar70 = vpmovsxwd_avx(auVar70);
                local_900._16_16_ = auVar70;
                local_900._0_16_ = auVar119;
                if ((((((((local_900 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_900 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_900 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_900 >> 0x7f,0) == '\0') &&
                      (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB161(auVar70 >> 0x3f,0) == '\0') &&
                    (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar70[0xf]) goto LAB_002de506;
                local_9c0 = local_ba0._0_4_;
                fStack_9bc = local_ba0._4_4_;
                fStack_9b8 = local_ba0._8_4_;
                fStack_9b4 = local_ba0._12_4_;
                fStack_9b0 = local_ba0._16_4_;
                fStack_9ac = local_ba0._20_4_;
                fStack_9a8 = local_ba0._24_4_;
                fStack_9a4 = local_ba0._28_4_;
                local_9a0 = local_b00._0_4_;
                fStack_99c = local_b00._4_4_;
                fStack_998 = local_b00._8_4_;
                fStack_994 = local_b00._12_4_;
                fStack_990 = local_b00._16_4_;
                fStack_98c = local_b00._20_4_;
                fStack_988 = local_b00._24_4_;
                fStack_984 = local_b00._28_4_;
                local_980 = local_b40;
                local_820 = local_b60;
                auVar72 = vrcpps_avx(local_b40);
                fVar1 = auVar72._0_4_;
                fVar11 = auVar72._4_4_;
                auVar53._4_4_ = local_b40._4_4_ * fVar11;
                auVar53._0_4_ = local_b40._0_4_ * fVar1;
                fVar12 = auVar72._8_4_;
                auVar53._8_4_ = local_b40._8_4_ * fVar12;
                fVar13 = auVar72._12_4_;
                auVar53._12_4_ = local_b40._12_4_ * fVar13;
                fVar14 = auVar72._16_4_;
                auVar53._16_4_ = local_b40._16_4_ * fVar14;
                fVar15 = auVar72._20_4_;
                auVar53._20_4_ = local_b40._20_4_ * fVar15;
                fVar16 = auVar72._24_4_;
                auVar53._24_4_ = local_b40._24_4_ * fVar16;
                auVar53._28_4_ = auVar70._12_4_;
                auVar123._8_4_ = 0x3f800000;
                auVar123._0_8_ = &DAT_3f8000003f800000;
                auVar123._12_4_ = 0x3f800000;
                auVar123._16_4_ = 0x3f800000;
                auVar123._20_4_ = 0x3f800000;
                auVar123._24_4_ = 0x3f800000;
                auVar123._28_4_ = 0x3f800000;
                auVar81 = vsubps_avx(auVar123,auVar53);
                auVar82._0_4_ = fVar1 + fVar1 * auVar81._0_4_;
                auVar82._4_4_ = fVar11 + fVar11 * auVar81._4_4_;
                auVar82._8_4_ = fVar12 + fVar12 * auVar81._8_4_;
                auVar82._12_4_ = fVar13 + fVar13 * auVar81._12_4_;
                auVar82._16_4_ = fVar14 + fVar14 * auVar81._16_4_;
                auVar82._20_4_ = fVar15 + fVar15 * auVar81._20_4_;
                auVar82._24_4_ = fVar16 + fVar16 * auVar81._24_4_;
                auVar82._28_4_ = auVar72._28_4_ + auVar81._28_4_;
                auVar96._8_4_ = 0x219392ef;
                auVar96._0_8_ = 0x219392ef219392ef;
                auVar96._12_4_ = 0x219392ef;
                auVar96._16_4_ = 0x219392ef;
                auVar96._20_4_ = 0x219392ef;
                auVar96._24_4_ = 0x219392ef;
                auVar96._28_4_ = 0x219392ef;
                auVar81 = vcmpps_avx(local_b20,auVar96,5);
                auVar72 = vandps_avx(auVar81,auVar82);
                auVar54._4_4_ = local_ba0._4_4_ * auVar72._4_4_;
                auVar54._0_4_ = local_ba0._0_4_ * auVar72._0_4_;
                auVar54._8_4_ = local_ba0._8_4_ * auVar72._8_4_;
                auVar54._12_4_ = local_ba0._12_4_ * auVar72._12_4_;
                auVar54._16_4_ = local_ba0._16_4_ * auVar72._16_4_;
                auVar54._20_4_ = local_ba0._20_4_ * auVar72._20_4_;
                auVar54._24_4_ = local_ba0._24_4_ * auVar72._24_4_;
                auVar54._28_4_ = auVar81._28_4_;
                auVar81 = vminps_avx(auVar54,auVar123);
                auVar55._4_4_ = local_b00._4_4_ * auVar72._4_4_;
                auVar55._0_4_ = local_b00._0_4_ * auVar72._0_4_;
                auVar55._8_4_ = local_b00._8_4_ * auVar72._8_4_;
                auVar55._12_4_ = local_b00._12_4_ * auVar72._12_4_;
                auVar55._16_4_ = local_b00._16_4_ * auVar72._16_4_;
                auVar55._20_4_ = local_b00._20_4_ * auVar72._20_4_;
                auVar55._24_4_ = local_b00._24_4_ * auVar72._24_4_;
                auVar55._28_4_ = auVar72._28_4_;
                auVar72 = vminps_avx(auVar55,auVar123);
                auVar19 = vsubps_avx(auVar123,auVar81);
                auVar73 = vsubps_avx(auVar123,auVar72);
                local_8c0 = vblendvps_avx(auVar72,auVar19,local_b60);
                local_8e0 = vblendvps_avx(auVar81,auVar73,local_b60);
                local_880._4_4_ = fVar89 * (float)local_b80._4_4_;
                local_880._0_4_ = fVar87 * (float)local_b80._0_4_;
                local_880._8_4_ = fVar91 * fStack_b78;
                local_880._12_4_ = fVar97 * fStack_b74;
                local_880._16_4_ = fVar98 * fStack_b70;
                local_880._20_4_ = fVar99 * fStack_b6c;
                local_880._24_4_ = fVar100 * fStack_b68;
                local_880._28_4_ = local_8c0._28_4_;
                local_860._4_4_ = fVar152 * (float)local_b80._4_4_;
                local_860._0_4_ = fVar151 * (float)local_b80._0_4_;
                local_860._8_4_ = fVar153 * fStack_b78;
                local_860._12_4_ = fVar154 * fStack_b74;
                local_860._16_4_ = fVar155 * fStack_b70;
                local_860._20_4_ = fVar156 * fStack_b6c;
                local_860._24_4_ = fVar85 * fStack_b68;
                local_860._28_4_ = local_8e0._28_4_;
                local_840[0] = (float)local_b80._0_4_ * fVar111;
                local_840[1] = (float)local_b80._4_4_ * fVar112;
                local_840[2] = fStack_b78 * fVar113;
                local_840[3] = fStack_b74 * fVar114;
                fStack_830 = fStack_b70 * fVar115;
                fStack_82c = fStack_b6c * fVar116;
                fStack_828 = fStack_b68 * fVar117;
                uStack_824 = local_920._28_4_;
                auVar71 = vpsllw_avx(auVar71,0xf);
                auVar71 = vpacksswb_avx(auVar71,auVar71);
                uVar61 = (ulong)(byte)(SUB161(auVar71 >> 7,0) & 1 |
                                       (SUB161(auVar71 >> 0xf,0) & 1) << 1 |
                                       (SUB161(auVar71 >> 0x17,0) & 1) << 2 |
                                       (SUB161(auVar71 >> 0x1f,0) & 1) << 3 |
                                       (SUB161(auVar71 >> 0x27,0) & 1) << 4 |
                                       (SUB161(auVar71 >> 0x2f,0) & 1) << 5 |
                                       (SUB161(auVar71 >> 0x37,0) & 1) << 6 |
                                      SUB161(auVar71 >> 0x3f,0) << 7);
                auVar150 = ZEXT1664(local_ca0);
                auVar157 = ZEXT1664(local_cb0);
                auVar159 = ZEXT1664(local_cc0);
                auVar161 = ZEXT1664(local_cd0);
                auVar164 = ZEXT1664(local_ce0);
                auVar180 = ZEXT1664(local_cf0);
                auVar194 = ZEXT1664(local_d00);
                auVar196 = ZEXT1664(local_d10);
                auVar124 = ZEXT1664(local_d20);
                auVar140 = ZEXT1664(local_d30);
                auVar110 = ZEXT1664(local_c90);
                do {
                  uVar67 = 0;
                  if (uVar61 != 0) {
                    for (; (uVar61 >> uVar67 & 1) == 0; uVar67 = uVar67 + 1) {
                    }
                  }
                  local_c48 = *(uint *)((long)&local_9e0 + uVar67 * 4);
                  pGVar9 = (pSVar3->geometries).items[local_c48].ptr;
                  if ((pGVar9->mask & ray->mask) == 0) {
                    uVar61 = uVar61 ^ 1L << (uVar67 & 0x3f);
                    bVar56 = true;
                  }
                  else {
                    pRVar10 = context->args;
                    if ((pRVar10->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar56 = false;
                    }
                    else {
                      local_c54 = *(undefined4 *)(local_8e0 + uVar67 * 4);
                      local_c50 = *(undefined4 *)(local_8c0 + uVar67 * 4);
                      local_c30.context = context->user;
                      local_c4c = *(undefined4 *)((long)&local_a00 + uVar67 * 4);
                      local_c60 = *(undefined4 *)(local_880 + uVar67 * 4);
                      local_c5c = local_840[uVar67 - 8];
                      local_c58 = local_840[uVar67];
                      local_c44 = (local_c30.context)->instID[0];
                      local_c40 = (local_c30.context)->instPrimID[0];
                      local_bc0 = ray->tfar;
                      ray->tfar = *(float *)(local_8a0 + uVar67 * 4);
                      local_d54 = -1;
                      local_c30.valid = &local_d54;
                      local_c30.geometryUserPtr = pGVar9->userPtr;
                      local_c30.hit = (RTCHitN *)&local_c60;
                      local_c30.N = 1;
                      local_c30.ray = (RTCRayN *)ray;
                      if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002de3fd:
                        if (pRVar10->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar10->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar10->filter)(&local_c30);
                            auVar140 = ZEXT1664(local_d30);
                            auVar124 = ZEXT1664(local_d20);
                            auVar196 = ZEXT1664(local_d10);
                            auVar194 = ZEXT1664(local_d00);
                            auVar180 = ZEXT1664(local_cf0);
                            auVar164 = ZEXT1664(local_ce0);
                            auVar161 = ZEXT1664(local_cd0);
                            auVar159 = ZEXT1664(local_cc0);
                            auVar157 = ZEXT1664(local_cb0);
                            auVar150 = ZEXT1664(local_ca0);
                          }
                          if (*local_c30.valid == 0) goto LAB_002de4a6;
                        }
                        bVar56 = false;
                      }
                      else {
                        local_be0 = context;
                        local_c00 = ray;
                        (*pGVar9->occlusionFilterN)(&local_c30);
                        auVar140 = ZEXT1664(local_d30);
                        auVar124 = ZEXT1664(local_d20);
                        auVar196 = ZEXT1664(local_d10);
                        auVar194 = ZEXT1664(local_d00);
                        auVar180 = ZEXT1664(local_cf0);
                        auVar164 = ZEXT1664(local_ce0);
                        auVar161 = ZEXT1664(local_cd0);
                        auVar159 = ZEXT1664(local_cc0);
                        auVar157 = ZEXT1664(local_cb0);
                        auVar150 = ZEXT1664(local_ca0);
                        context = local_be0;
                        ray = local_c00;
                        if (*local_c30.valid != 0) goto LAB_002de3fd;
LAB_002de4a6:
                        ray->tfar = local_bc0;
                        uVar61 = uVar61 ^ 1L << (uVar67 & 0x3f);
                        bVar56 = true;
                      }
                      auVar110 = ZEXT1664(local_c90);
                    }
                  }
                  iVar66 = 0;
                  uVar67 = local_d38;
                  uVar68 = local_d40;
                  if (!bVar56) {
                    if (bVar69) {
                      ray->tfar = -INFINITY;
                      iVar66 = 3;
                    }
                    goto LAB_002de591;
                  }
                } while (uVar61 != 0);
              }
              iVar66 = 0;
              local_c70 = local_c70 + 1;
              bVar69 = local_c70 < local_c78;
            } while (local_c70 != local_c78);
          }
        }
LAB_002de591:
      } while (iVar66 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }